

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

void __thiscall
HighsSymmetryDetection::run(HighsSymmetryDetection *this,HighsSymmetries *symmetries)

{
  vector<int,_std::allocator<int>_> *this_00;
  int iVar1;
  pointer pNVar2;
  pointer piVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  bool bVar4;
  bool bVar5;
  HighsInt HVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ValueType *pVVar10;
  ValueType *pVVar11;
  pointer puVar12;
  pointer pNVar13;
  HighsInt i_6;
  pointer puVar14;
  HighsInt i_5;
  int *piVar15;
  KeyType_conflict *key;
  pointer piVar16;
  size_type __new_size;
  int iVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  pointer piVar21;
  HighsInt i_1;
  uint uVar22;
  HighsInt *pHVar23;
  long lVar24;
  pointer piVar25;
  int iVar26;
  HighsInt p;
  HighsInt wrongCell;
  ComponentData componentData;
  int local_1c0;
  int local_1bc;
  vector<int,_std::allocator<int>_> *local_1b8;
  vector<int,std::allocator<int>> *local_1b0;
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *local_1a8;
  vector<int,_std::allocator<int>_> *local_1a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_198;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_190;
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *local_188;
  vector<int,_std::allocator<int>_> *local_180;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_178;
  vector<int,_std::allocator<int>_> *local_170;
  HighsSplitDeque *local_168;
  HighsHashTable<int,_void> local_160;
  ComponentData local_138;
  
  initializeGroundSet(this);
  puVar12 = (this->currNodeCertificate).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->currNodeCertificate).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar12) {
    (this->currNodeCertificate).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar12;
  }
  piVar16 = (this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar16) {
    (this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar16;
  }
  local_190 = &this->currNodeCertificate;
  createNode(this);
  local_1bc = (int)(64000000 / (long)this->numActiveCols);
  local_168 = HighsTaskExecutor::getThisWorkerDeque();
  local_170 = &this->firstLeavePartition;
  local_198 = &this->bestLeaveCertificate;
  local_1a8 = &this->bestLeaveGraph;
  local_1a0 = &this->currentPartition;
  local_180 = &this->bestLeavePartition;
  local_188 = &this->firstLeaveGraph;
  local_1b8 = &this->vertexPosition;
  this_00 = &this->vertexGroundSet;
  local_1b0 = (vector<int,std::allocator<int>> *)&symmetries->permutations;
  local_178 = &this->firstLeaveCertificate;
LAB_002f7e66:
  do {
    pNVar13 = (this->nodeStack).
              super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pNVar2 = (this->nodeStack).
             super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pNVar13 == pNVar2) {
      iVar26 = symmetries->numPerms;
LAB_002f83c5:
      symmetries->numGenerators = iVar26;
      if (0 < iVar26) {
        std::vector<int,_std::allocator<int>_>::resize(local_1b8,(long)this->numCol);
        computeComponentData(&local_138,this,symmetries);
        uVar22 = (int)((ulong)((long)local_138.componentStarts.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)local_138.componentStarts.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2) - 1;
        uVar20 = 0;
        uVar9 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar9 = uVar20;
        }
        for (; uVar9 != uVar20; uVar20 = uVar20 + 1) {
          if (local_138.componentStarts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar20 + 1] -
              local_138.componentStarts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar20] != 1) {
            isFullOrbitope(this,&local_138,(HighsInt)uVar20,symmetries);
          }
        }
        HighsHashTable<int,_void>::HighsHashTable(&local_160);
        for (local_1c0 = 0; local_1c0 < symmetries->numPerms; local_1c0 = local_1c0 + 1) {
          iVar26 = this->numActiveCols;
          key = (KeyType_conflict *)((long)(local_1c0 * iVar26) * 4 + *(long *)local_1b0);
          for (lVar18 = 0; lVar18 < iVar26; lVar18 = lVar18 + 1) {
            if (*key != (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar18]) {
              pVVar10 = HighsHashTable<int,_int>::find(&symmetries->columnToOrbitope,key);
              if (pVVar10 != (ValueType *)0x0) {
                HighsHashTable<int,void>::insert<int&>
                          ((HighsHashTable<int,void> *)&local_160,&local_1c0);
                break;
              }
              iVar26 = this->numActiveCols;
            }
            key = key + 1;
          }
        }
        lVar24 = 0;
        lVar18 = 0;
        iVar26 = 0;
        while( true ) {
          iVar7 = this->numActiveCols;
          __new_size = (size_type)iVar7;
          if ((long)__new_size <= lVar18) break;
          HVar6 = getOrbit(this,*(HighsInt *)
                                 ((long)(this->vertexGroundSet).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar24));
          if (((this->orbitSize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[HVar6] == 1) ||
             (pVVar10 = HighsHashTable<int,_int>::find
                                  (&symmetries->columnToOrbitope,
                                   (KeyType_conflict *)
                                   ((long)(this_00->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data._M_start + lVar24)),
             pVVar10 != (ValueType *)0x0)) {
            piVar16 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            (local_1b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[*(int *)((long)piVar16 + lVar24)] = -1;
            *(undefined4 *)((long)piVar16 + lVar24) = 0xffffffff;
            iVar26 = iVar26 + 1;
          }
          lVar18 = lVar18 + 1;
          lVar24 = lVar24 + 4;
        }
        if (iVar26 != 0) {
          local_1c0 = 0;
          piVar16 = (symmetries->permutations).super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start;
          piVar21 = piVar16 + (long)symmetries->numPerms * __new_size;
          piVar25 = piVar16;
          for (; piVar16 != piVar21; piVar16 = piVar16 + lVar24) {
            pVVar11 = HighsHashTable<int,_void>::find(&local_160,&local_1c0);
            if (pVVar11 == (ValueType *)0x0) {
              piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              lVar18 = 0;
              while( true ) {
                iVar7 = this->numActiveCols;
                lVar24 = (long)iVar7;
                if (lVar24 <= lVar18) break;
                if (piVar3[lVar18] != -1) {
                  *piVar25 = piVar16[lVar18];
                  piVar25 = piVar25 + 1;
                }
                lVar18 = lVar18 + 1;
              }
            }
            else {
              symmetries->numPerms = symmetries->numPerms + -1;
              iVar7 = this->numActiveCols;
              lVar24 = (long)iVar7;
            }
            local_1c0 = local_1c0 + 1;
          }
          piVar16 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          piVar25 = (local_1b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          iVar17 = 0;
          for (lVar18 = 0; lVar18 < iVar7; lVar18 = lVar18 + 1) {
            iVar1 = piVar16[lVar18];
            if ((long)iVar1 != -1) {
              piVar16[iVar17] = iVar1;
              piVar25[iVar1] = iVar17;
              iVar17 = iVar17 + 1;
              iVar7 = this->numActiveCols;
            }
          }
          this->numActiveCols = iVar7 - iVar26;
          __new_size = (size_type)(iVar7 - iVar26);
        }
        std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size);
        std::vector<int,_std::allocator<int>_>::_M_move_assign
                  (&symmetries->permutationColumns,this_00);
        std::vector<int,_std::allocator<int>_>::_M_move_assign
                  (&symmetries->columnPosition,local_1b8);
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)local_1b0,
                   (long)this->numActiveCols * (long)symmetries->numPerms);
        HighsHashTable<int,_void>::~HighsHashTable(&local_160);
        ComponentData::~ComponentData(&local_138);
      }
      return;
    }
    HVar6 = selectTargetCell(this);
    if (HVar6 != -1) {
      pNVar2[-1].targetCell = HVar6;
      determineNextToDistinguish(this);
      bVar4 = distinguishVertex(this,HVar6);
      if (bVar4) {
        bVar4 = partitionRefinement(this);
        if (bVar4) {
          createNode(this);
          goto LAB_002f7e66;
        }
        HVar6 = (HighsInt)
                ((ulong)((long)(this->nodeStack).
                               super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->nodeStack).
                              super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4);
      }
      else {
        HVar6 = (int)((ulong)((long)(this->nodeStack).
                                    super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->nodeStack).
                                   super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1;
      }
      switchToNextNode(this,HVar6);
      goto LAB_002f7e66;
    }
    if ((this->firstLeavePartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->firstLeavePartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<int,_std::allocator<int>_>::operator=(local_170,local_1a0);
      __x = local_190;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(local_178,local_190);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(local_198,__x);
      dumpCurrentGraph((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)&local_138,this);
      HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::operator=
                (local_188,(HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)&local_138);
      HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::~HighsHashTable
                ((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)&local_138);
      puVar12 = (this->currNodeCertificate).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pNVar13 = (this->nodeStack).
                super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar9 = (long)(this->nodeStack).
                    super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar13;
      uVar20 = uVar9 >> 4;
      this->firstPathDepth = (HighsInt)uVar20;
      this->bestPathDepth = (HighsInt)uVar20;
      HVar6 = (HighsInt)
              ((ulong)((long)puVar12 -
                      (long)(this->currNodeCertificate).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
      this->firstLeavePrefixLen = HVar6;
      this->bestLeavePrefixLen = HVar6;
      pHVar23 = (HighsInt *)((long)pNVar13 + ((uVar9 & 0xffffffff0) - 0x18));
      do {
        iVar26 = (int)uVar20;
        if (iVar26 < 2) break;
        bVar4 = isFromBinaryColumn(this,*pHVar23);
        pHVar23 = pHVar23 + -4;
        uVar20 = (ulong)(iVar26 - 1);
      } while (!bVar4);
      uVar22 = iVar26 - 1;
    }
    else {
      local_160.entries._M_t.
      super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
      .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>._M_head_impl._0_4_ = -1;
      uVar19 = (int)((ulong)((long)pNVar2 - (long)pNVar13) >> 4) - 1;
      puVar12 = (this->currNodeCertificate).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar14 = (this->currNodeCertificate).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      iVar26 = (int)((ulong)((long)puVar14 - (long)puVar12) >> 2);
      uVar22 = uVar19;
      if (this->firstLeavePrefixLen == iVar26) {
        bVar4 = compareCurrentGraph(this,local_188,(HighsInt *)&local_160);
        if (bVar4) {
          uVar8 = this->numAutomorphisms;
          this->numAutomorphisms = uVar8 + 1;
          iVar26 = this->numVertices;
          piVar15 = (this->automorphisms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + (int)((uVar8 & 0x3f) * iVar26);
          piVar16 = (this->firstLeavePartition).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          piVar25 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar21 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          for (lVar18 = 0; lVar18 < iVar26; lVar18 = lVar18 + 1) {
            piVar15[piVar21[piVar25[lVar18]]] = piVar16[lVar18];
            iVar26 = this->numVertices;
          }
          bVar4 = false;
          for (lVar18 = 0; lVar18 < iVar26; lVar18 = lVar18 + 1) {
            bVar5 = mergeOrbits(this,piVar15[lVar18],
                                (this->vertexGroundSet).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar18]);
            iVar26 = this->numVertices;
            bVar4 = (bool)(bVar4 | (lVar18 < this->numActiveCols && bVar5));
          }
          if (bVar4) {
            std::vector<int,std::allocator<int>>::insert<int*,void>
                      (local_1b0,
                       (const_iterator)
                       (symmetries->permutations).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,piVar15,
                       piVar15 + this->numActiveCols);
            iVar7 = symmetries->numPerms + 1;
            symmetries->numPerms = iVar7;
            iVar26 = local_1bc;
            if (iVar7 == local_1bc) goto LAB_002f83c5;
          }
          uVar8 = this->firstPathDepth;
LAB_002f8399:
          if ((int)uVar8 < (int)uVar19) {
            uVar22 = uVar8;
          }
        }
        else {
          iVar26 = this->bestLeavePrefixLen;
          puVar12 = (this->currNodeCertificate).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar14 = (this->currNodeCertificate).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
LAB_002f8134:
          if (((this->bestLeavePartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start !=
               (this->bestLeavePartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish) &&
             (iVar26 == (int)((ulong)((long)puVar14 - (long)puVar12) >> 2))) {
            bVar4 = compareCurrentGraph(this,local_1a8,(HighsInt *)&local_160);
            if (bVar4) {
              uVar8 = this->numAutomorphisms;
              this->numAutomorphisms = uVar8 + 1;
              iVar26 = this->numVertices;
              piVar15 = (this->automorphisms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + (int)((uVar8 & 0x3f) * iVar26);
              piVar16 = (this->bestLeavePartition).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              piVar25 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              piVar21 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start;
              for (lVar18 = 0; lVar18 < iVar26; lVar18 = lVar18 + 1) {
                piVar15[piVar21[piVar25[lVar18]]] = piVar16[lVar18];
                iVar26 = this->numVertices;
              }
              bVar4 = false;
              for (lVar18 = 0; lVar18 < iVar26; lVar18 = lVar18 + 1) {
                bVar5 = mergeOrbits(this,piVar15[lVar18],
                                    (this->vertexGroundSet).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar18]);
                iVar26 = this->numVertices;
                bVar4 = (bool)(bVar4 | (lVar18 < this->numActiveCols && bVar5));
              }
              if (bVar4) {
                std::vector<int,std::allocator<int>>::insert<int*,void>
                          (local_1b0,
                           (const_iterator)
                           (symmetries->permutations).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,piVar15,
                           piVar15 + this->numActiveCols);
                iVar7 = symmetries->numPerms + 1;
                symmetries->numPerms = iVar7;
                iVar26 = local_1bc;
                if (iVar7 == local_1bc) goto LAB_002f83c5;
              }
              uVar8 = this->bestPathDepth;
              goto LAB_002f8399;
            }
            iVar26 = this->bestLeavePrefixLen;
            puVar12 = (this->currNodeCertificate).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar14 = (this->currNodeCertificate).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          uVar8 = uVar19;
          if (iVar26 < (int)((ulong)((long)puVar14 - (long)puVar12) >> 2)) {
            pNVar13 = (this->nodeStack).
                      super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((this->bestLeaveCertificate).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar26] < puVar12[iVar26]) {
              uVar22 = this->firstPathDepth - 2;
              pHVar23 = &pNVar13[this->firstPathDepth + -1].certificateEnd;
              do {
                uVar22 = uVar22 + 1;
                iVar7 = *pHVar23;
                pHVar23 = pHVar23 + 4;
              } while (iVar7 <= iVar26);
              if ((int)uVar19 < (int)uVar22) {
                uVar22 = uVar19;
              }
              goto LAB_002f83a6;
            }
          }
          else {
            pNVar13 = (this->nodeStack).
                      super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          while ((uVar22 = uVar19, -1 < (int)uVar8 &&
                 (uVar22 = uVar8,
                 pNVar13[uVar8].targetCell !=
                 (int)local_160.entries._M_t.
                      super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
                      .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>._M_head_impl))
                ) {
            uVar8 = uVar8 - 1;
          }
        }
      }
      else {
        if (this->bestLeavePrefixLen == iVar26) goto LAB_002f8134;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(local_198,local_190);
        dumpCurrentGraph((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)&local_138,this
                        );
        HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::operator=
                  (local_1a8,(HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)&local_138)
        ;
        HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::~HighsHashTable
                  ((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)&local_138);
        std::vector<int,_std::allocator<int>_>::operator=(local_180,local_1a0);
        puVar12 = (this->currNodeCertificate).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        this->bestPathDepth =
             (HighsInt)
             ((ulong)((long)(this->nodeStack).
                            super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->nodeStack).
                           super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4);
        this->bestLeavePrefixLen =
             (HighsInt)
             ((ulong)((long)puVar12 -
                     (long)(this->currNodeCertificate).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2);
      }
    }
LAB_002f83a6:
    switchToNextNode(this,uVar22);
    HighsSplitDeque::checkInterrupt(local_168);
  } while( true );
}

Assistant:

void HighsSymmetryDetection::run(HighsSymmetries& symmetries) {
  assert(numActiveCols != 0);
  initializeGroundSet();
  currNodeCertificate.clear();
  cellCreationStack.clear();
  createNode();
  HighsInt maxPerms = 64000000 / numActiveCols;
  HighsSplitDeque* workerDeque = HighsTaskExecutor::getThisWorkerDeque();
  while (!nodeStack.empty()) {
    HighsInt targetCell = selectTargetCell();
    if (targetCell == -1) {
      if (firstLeavePartition.empty()) {
        firstLeavePartition = currentPartition;
        firstLeaveCertificate = currNodeCertificate;
        bestLeaveCertificate = currNodeCertificate;
        firstLeaveGraph = dumpCurrentGraph();
        firstPathDepth = nodeStack.size();
        bestPathDepth = nodeStack.size();
        firstLeavePrefixLen = currNodeCertificate.size();
        bestLeavePrefixLen = currNodeCertificate.size();

        HighsInt backtrackDepth = firstPathDepth - 1;
        while (backtrackDepth > 0 &&
               !isFromBinaryColumn(nodeStack[backtrackDepth - 1].targetCell))
          --backtrackDepth;
        switchToNextNode(backtrackDepth);
      } else {
        HighsInt wrongCell = -1;
        HighsInt backtrackDepth = nodeStack.size() - 1;
        assert(currNodeCertificate.size() == firstLeaveCertificate.size());
        if (firstLeavePrefixLen == (HighsInt)currNodeCertificate.size() ||
            bestLeavePrefixLen == (HighsInt)currNodeCertificate.size()) {
          if (firstLeavePrefixLen == (HighsInt)currNodeCertificate.size() &&
              compareCurrentGraph(firstLeaveGraph, wrongCell)) {
            HighsInt k = (numAutomorphisms++) & 63;
            HighsInt* permutation = automorphisms.data() + k * numVertices;
            for (HighsInt i = 0; i < numVertices; ++i) {
              HighsInt firstLeaveCol = firstLeavePartition[i];
              permutation[vertexPosition[currentPartition[i]]] = firstLeaveCol;
            }

            bool report = false;
            for (HighsInt i = 0; i < numVertices; ++i) {
              if (mergeOrbits(permutation[i], vertexGroundSet[i]) &&
                  i < numActiveCols) {
                assert(permutation[i] < numCol);
                report = true;
              }
            }

            if (report) {
              symmetries.permutations.insert(symmetries.permutations.end(),
                                             permutation,
                                             permutation + numActiveCols);
              ++symmetries.numPerms;
              if (symmetries.numPerms == maxPerms) break;
            }
            backtrackDepth = std::min(backtrackDepth, firstPathDepth);
          } else if (!bestLeavePartition.empty() &&
                     bestLeavePrefixLen ==
                         (HighsInt)currNodeCertificate.size() &&
                     compareCurrentGraph(bestLeaveGraph, wrongCell)) {
            HighsInt k = (numAutomorphisms++) & 63;
            HighsInt* permutation = automorphisms.data() + k * numVertices;
            for (HighsInt i = 0; i < numVertices; ++i) {
              HighsInt bestLeaveCol = bestLeavePartition[i];
              permutation[vertexPosition[currentPartition[i]]] = bestLeaveCol;
            }

            bool report = false;
            for (HighsInt i = 0; i < numVertices; ++i) {
              if (mergeOrbits(permutation[i], vertexGroundSet[i]) &&
                  i < numActiveCols) {
                assert(permutation[i] < numCol);
                report = true;
              }
            }

            if (report) {
              symmetries.permutations.insert(symmetries.permutations.end(),
                                             permutation,
                                             permutation + numActiveCols);
              ++symmetries.numPerms;
              if (symmetries.numPerms == maxPerms) break;
            }

            backtrackDepth = std::min(backtrackDepth, bestPathDepth);
          } else if (bestLeavePrefixLen <
                         (HighsInt)currNodeCertificate.size() &&
                     currNodeCertificate[bestLeavePrefixLen] >
                         bestLeaveCertificate[bestLeavePrefixLen]) {
            // certificate value is lexicographically above the smallest one
            // seen so far, so we might be able to backtrack to a higher level
            HighsInt possibleBacktrackDepth = firstPathDepth - 1;
            while (nodeStack[possibleBacktrackDepth].certificateEnd <=
                   bestLeavePrefixLen)
              ++possibleBacktrackDepth;

            backtrackDepth = std::min(possibleBacktrackDepth, backtrackDepth);
          } else {
            // This case can be caused by a hash collision which was now
            // detected in the graph comparison call. The graph comparison call
            // will return the cell where the vertex neighbourhood caused a
            // mismatch on the edges. This would have been detected by
            // an exact partition refinement when we targeted that cell the last
            // time, so that is where we can backtrack to.
            HighsInt possibleBacktrackDepth;
            for (possibleBacktrackDepth = backtrackDepth;
                 possibleBacktrackDepth >= 0; --possibleBacktrackDepth) {
              if (nodeStack[possibleBacktrackDepth].targetCell == wrongCell) {
                backtrackDepth = possibleBacktrackDepth;
                break;
              }
            }
          }
        } else {
          // leave must have a lexicographically smaller certificate value
          // than the current best leave, because its prefix length is smaller
          // than the best leaves and it would have been already pruned if
          // it's certificate value was larger unless it is equal to the first
          // leaf nodes certificate value which is caught by the first case
          // of the if condition. Hence, having a lexicographically smaller
          // certificate value than the best leave is the only way to get
          // here.
          assert(bestLeaveCertificate[bestLeavePrefixLen] >
                     currNodeCertificate[bestLeavePrefixLen] &&
                 std::memcmp(bestLeaveCertificate.data(),
                             currNodeCertificate.data(),
                             bestLeavePrefixLen * sizeof(u32)) == 0);
          bestLeaveCertificate = currNodeCertificate;
          bestLeaveGraph = dumpCurrentGraph();
          bestLeavePartition = currentPartition;
          bestPathDepth = nodeStack.size();
          bestLeavePrefixLen = currNodeCertificate.size();
        }

        switchToNextNode(backtrackDepth);
      }

      workerDeque->checkInterrupt();
    } else {
      Node& currNode = nodeStack.back();
      currNode.targetCell = targetCell;
      bool success = determineNextToDistinguish();
      assert(success);
      if (!distinguishVertex(targetCell)) {
        switchToNextNode(nodeStack.size() - 1);
        continue;
      }
      if (!partitionRefinement()) {
        switchToNextNode(nodeStack.size());
        continue;
      }

      createNode();
    }
  }

  symmetries.numGenerators = symmetries.numPerms;
  if (symmetries.numPerms > 0) {
    vertexPosition.resize(numCol);

    ComponentData componentData = computeComponentData(symmetries);
    HighsInt numComponents = componentData.numComponents();

    for (HighsInt i = 0; i < numComponents; ++i) {
      if (componentData.componentSize(i) == 1) continue;

      isFullOrbitope(componentData, i, symmetries);
    }

    HighsHashTable<HighsInt> deletedPerms;
    for (HighsInt p = 0; p < symmetries.numPerms; ++p) {
      HighsInt* perm = symmetries.permutations.data() + p * numActiveCols;
      for (HighsInt i = 0; i < numActiveCols; ++i) {
        if (perm[i] != vertexGroundSet[i] &&
            symmetries.columnToOrbitope.find(perm[i])) {
          deletedPerms.insert(p);
          break;
        }
      }
    }

    // check which columns have non-trivial orbits
    HighsInt numFixed = 0;
    for (HighsInt i = 0; i < numActiveCols; ++i) {
      if (orbitSize[getOrbit(vertexGroundSet[i])] == 1 ||
          symmetries.columnToOrbitope.find(vertexGroundSet[i])) {
        vertexPosition[vertexGroundSet[i]] = -1;
        vertexGroundSet[i] = -1;
        numFixed += 1;
      }
    }

    if (numFixed != 0) {
      // now compress symmetries and the groundset to only contain the unfixed
      // columns and columns not handled by full orbitopes
      HighsInt p = 0;
      HighsInt* perms = symmetries.permutations.data();
      HighsInt* permEnd =
          symmetries.permutations.data() + symmetries.numPerms * numActiveCols;
      HighsInt* permOutput = symmetries.permutations.data();
      while (perms != permEnd) {
        if (!deletedPerms.find(p)) {
          for (HighsInt i = 0; i < numActiveCols; ++i) {
            if (vertexGroundSet[i] == -1) continue;

            *permOutput = perms[i];
            ++permOutput;
          }
        } else {
          --symmetries.numPerms;
        }
        perms += numActiveCols;
        ++p;
      }

      HighsInt outPos = 0;
      for (HighsInt i = 0; i < numActiveCols; ++i) {
        if (vertexGroundSet[i] == -1) continue;

        vertexGroundSet[outPos] = vertexGroundSet[i];
        vertexPosition[vertexGroundSet[outPos]] = outPos;
        outPos += 1;
      }

      numActiveCols -= numFixed;
      assert(permOutput == symmetries.permutations.data() +
                               symmetries.numPerms * numActiveCols);
    }

    vertexGroundSet.resize(numActiveCols);
    symmetries.permutationColumns = std::move(vertexGroundSet);
    symmetries.columnPosition = std::move(vertexPosition);
    symmetries.permutations.resize(symmetries.numPerms * numActiveCols);
  }
}